

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy.c
# Opt level: O1

ssize_t mpt_memcpy(ssize_t len,iovec *src,size_t nsrc,iovec *dest,size_t ndest)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  size_t *psVar4;
  ulong __n;
  size_t sVar5;
  size_t sVar6;
  void *__dest;
  ssize_t sVar7;
  void *__src;
  size_t local_58;
  iovec *local_50;
  iovec *local_48;
  
  if (nsrc == 0 || ndest == 0) {
    sVar7 = 0;
  }
  else {
    __src = src->iov_base;
    sVar6 = src->iov_len;
    __dest = dest->iov_base;
    sVar5 = dest->iov_len;
    if (0 < len) {
      sVar2 = sVar6;
      if (1 < nsrc) {
        lVar3 = nsrc - 1;
        psVar4 = &src[1].iov_len;
        do {
          sVar2 = sVar2 + *psVar4;
          psVar4 = psVar4 + 2;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      if ((long)sVar2 < len) {
        sVar7 = -1;
        bVar1 = false;
      }
      else {
        sVar2 = sVar5;
        if (1 < ndest) {
          lVar3 = ndest - 1;
          psVar4 = &dest[1].iov_len;
          do {
            sVar2 = sVar2 + *psVar4;
            psVar4 = psVar4 + 2;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        bVar1 = len <= (long)sVar2;
        sVar7 = -2;
      }
      if (!bVar1) {
        return sVar7;
      }
    }
    sVar7 = 0;
    local_58 = ndest;
    local_50 = dest;
    local_48 = src;
    do {
      if (len == 0) {
        return sVar7;
      }
      if (sVar6 == 0) {
        nsrc = nsrc - 1;
        if (nsrc == 0) {
          bVar1 = true;
          nsrc = 0;
          sVar6 = 0;
        }
        else {
          __src = local_48[1].iov_base;
          sVar6 = local_48[1].iov_len;
          local_48 = local_48 + 1;
          bVar1 = false;
        }
      }
      else if (sVar5 == 0) {
        local_58 = local_58 - 1;
        if (local_58 == 0) {
          bVar1 = true;
          local_58 = 0;
          sVar5 = 0;
        }
        else {
          __dest = local_50[1].iov_base;
          sVar5 = local_50[1].iov_len;
          local_50 = local_50 + 1;
          bVar1 = false;
        }
      }
      else {
        __n = len;
        if (sVar6 < (ulong)len) {
          __n = sVar6;
        }
        if (sVar5 < __n) {
          __n = sVar5;
        }
        memcpy(__dest,__src,__n);
        __src = (void *)((long)__src + __n);
        sVar6 = sVar6 - __n;
        __dest = (void *)((long)__dest + __n);
        sVar5 = sVar5 - __n;
        sVar7 = sVar7 + __n;
        len = len - __n;
        bVar1 = false;
      }
    } while (!bVar1);
  }
  return sVar7;
}

Assistant:

extern ssize_t mpt_memcpy(ssize_t len,
			  const struct iovec *src,  size_t nsrc,
			  const struct iovec *dest, size_t ndest)
{
	int8_t	*source, *target;
	size_t	total = 0, left, space;
	
	if (!ndest || !nsrc)
		return 0;
	
	source = src->iov_base;
	left   = src->iov_len;
	
	target = dest->iov_base;
	space  = dest->iov_len;
	
	/* check maximum size */
	if (len > 0) {
		size_t pos;
		for (total = left,  pos = 1; pos < nsrc;  ++pos) total += src[pos].iov_len;
		if (len > (ssize_t) total) return -1;
		for (total = space, pos = 1; pos < ndest; ++pos) total += dest[pos].iov_len;
		if (len > (ssize_t) total) return -2;
	}
	total = 0;
	
	while (len) {
		size_t copy = len;
		if (!left) {
			if (!(--nsrc)) break;
			++src;
			source = src->iov_base;
			left   = src->iov_len;
			continue;
		}
		if (!space) {
			if (!(--ndest)) break;
			++dest;
			target = dest->iov_base;
			space  = dest->iov_len;
			continue;
		}
		if (left  < copy) copy = left;
		if (space < copy) copy = space;
		
		memcpy(target, source, copy);
		
		source += copy;
		left   -= copy;
		
		target += copy;
		space  -= copy;
		
		total += copy;
		len   -= copy;
	}
	return total;
}